

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool duckdb::ApproxEqual(float ldecimal,float rdecimal)

{
  bool bVar1;
  
  bVar1 = Value::IsNan<float>(ldecimal);
  if ((bVar1) && (bVar1 = Value::IsNan<float>(rdecimal), bVar1)) {
    return true;
  }
  bVar1 = Value::FloatIsFinite(ldecimal);
  if ((bVar1) && (bVar1 = Value::FloatIsFinite(rdecimal), bVar1)) {
    return ABS(ldecimal - rdecimal) <= ABS(rdecimal) * 0.01 + 1e-08;
  }
  return (bool)(-(ldecimal == rdecimal) & 1);
}

Assistant:

bool ApproxEqual(float ldecimal, float rdecimal) {
	if (Value::IsNan(ldecimal) && Value::IsNan(rdecimal)) {
		return true;
	}
	if (!Value::FloatIsFinite(ldecimal) || !Value::FloatIsFinite(rdecimal)) {
		return ldecimal == rdecimal;
	}
	float epsilon = static_cast<float>(std::fabs(rdecimal) * 0.01 + 0.00000001);
	return std::fabs(ldecimal - rdecimal) <= epsilon;
}